

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::~QMenu(QMenu *this)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  QWidget *widget;
  Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *pDVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00804f08;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMenu_008050c0;
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  pDVar4 = *(Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> **)(lVar2 + 0x270);
  if ((pDVar4 == (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0) || (pDVar4->size == 0)) {
LAB_00467f23:
    if (*(long *)(lVar2 + 0x2b0) != 0) {
      QEventLoop::exit((int)*(long *)(lVar2 + 0x2b0));
    }
    hideTearOffMenu(this);
    QWidget::~QWidget(&this->super_QWidget);
    return;
  }
  if (pDVar4 == (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0) {
    lVar8 = 0;
  }
  else {
    if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QAction_*,_QWidget_*>_>::detached(pDVar4);
      *(Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> **)(lVar2 + 0x270) = pDVar4;
    }
    lVar8 = *(long *)(lVar2 + 0x270);
    if (**(char **)(lVar8 + 0x20) == -1) {
      uVar5 = 1;
      do {
        uVar6 = uVar5;
        if (*(ulong *)(lVar8 + 0x10) == uVar6) goto LAB_00467e72;
        uVar5 = uVar6 + 1;
      } while ((*(char **)(lVar8 + 0x20))[(ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90] == -1);
      goto LAB_00467e75;
    }
  }
  uVar6 = 0;
LAB_00467e75:
  while ((uVar6 != 0 || (lVar8 != 0))) {
    lVar7 = (uVar6 >> 7) * 0x90;
    uVar5 = (ulong)((uint)uVar6 & 0x7f);
    lVar3 = *(long *)(*(long *)(lVar8 + 0x20) + 0x80 + lVar7);
    bVar1 = *(byte *)(uVar5 + *(long *)(lVar8 + 0x20) + lVar7);
    widget = *(QWidget **)(lVar3 + 8 + (ulong)bVar1 * 0x10);
    if (widget != (QWidget *)0x0) {
      QWidgetAction::releaseWidget(*(QWidgetAction **)(lVar3 + (ulong)bVar1 * 0x10),widget);
      *(undefined8 *)
       (*(long *)(*(long *)(lVar8 + 0x20) + 0x80 + lVar7) + 8 +
       (ulong)*(byte *)(uVar5 + *(long *)(lVar8 + 0x20) + lVar7) * 0x10) = 0;
    }
    do {
      if (*(long *)(lVar8 + 0x10) - 1U == uVar6) goto LAB_00467e72;
      uVar6 = uVar6 + 1;
    } while (*(char *)((ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90 + *(long *)(lVar8 + 0x20))
             == -1);
  }
  goto LAB_00467f23;
LAB_00467e72:
  uVar6 = 0;
  lVar8 = 0;
  goto LAB_00467e75;
}

Assistant:

QMenu::~QMenu()
{
    Q_D(QMenu);
    if (!d->widgetItems.isEmpty()) {  // avoid detach on shared null hash
        QHash<QAction *, QWidget *>::iterator it = d->widgetItems.begin();
        for (; it != d->widgetItems.end(); ++it) {
            if (QWidget *widget = it.value()) {
                QWidgetAction *action = static_cast<QWidgetAction *>(it.key());
                action->releaseWidget(widget);
                *it = 0;
            }
        }
    }

    if (d->eventLoop)
        d->eventLoop->exit();
    hideTearOffMenu();
}